

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::FileGenerator::Generate(FileGenerator *this,Printer *printer)

{
  FileDescriptor *pFVar1;
  Printer *pPVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  string *psVar6;
  ulong uVar7;
  scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator> *psVar8;
  ExtensionGenerator *pEVar9;
  scoped_ptr<google::protobuf::compiler::java::MessageGenerator> *psVar10;
  MessageGenerator *pMVar11;
  Context *pCVar12;
  EnumDescriptor *pEVar13;
  GeneratorFactory *pGVar14;
  ServiceDescriptor *pSVar15;
  undefined4 extraout_var;
  ServiceGenerator *pSVar16;
  int local_120;
  int local_11c;
  int i_7;
  int method_num;
  int bytecode_estimate;
  int i_6;
  int static_block_bytecode_estimate;
  int i_5;
  scoped_ptr<google::protobuf::compiler::java::ServiceGenerator> generator;
  int i_4;
  int i_3;
  EnumGenerator local_a8;
  int local_58;
  int local_54;
  int i_2;
  int i_1;
  int i;
  byte local_3a;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Printer *local_18;
  Printer *printer_local;
  FileGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  psVar6 = FileDescriptor::name_abi_cxx11_(this->file_);
  io::Printer::Print(printer,
                     "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                     ,"filename",psVar6);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    io::Printer::Print(local_18,"package $package$;\n\n","package",&this->java_package_);
  }
  pPVar2 = local_18;
  local_3a = 0;
  if (((this->options_).annotate_code & 1U) == 0) {
    std::allocator<char>::allocator();
    local_3a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  }
  else {
    std::operator+(&local_38,&this->classname_,".java.pb.meta");
  }
  PrintGeneratedAnnotation(pPVar2,'$',&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if ((local_3a & 1) != 0) {
    std::allocator<char>::~allocator(&local_39);
  }
  io::Printer::Print(local_18,"public final class $classname$ {\n  private $ctor$() {}\n",
                     "classname",&this->classname_,"ctor",&this->classname_);
  pPVar2 = local_18;
  psVar6 = FileDescriptor::name_abi_cxx11_(this->file_);
  io::Printer::Annotate(pPVar2,"classname",psVar6);
  io::Printer::Indent(local_18);
  io::Printer::Print(local_18,
                     "public static void registerAllExtensions(\n    com.google.protobuf.ExtensionRegistryLite registry) {\n"
                    );
  io::Printer::Indent(local_18);
  for (i_2 = 0; iVar5 = i_2, iVar4 = FileDescriptor::extension_count(this->file_), iVar5 < iVar4;
      i_2 = i_2 + 1) {
    psVar8 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>_>
             ::operator[](&this->extension_generators_,(long)i_2);
    pEVar9 = internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>::operator->
                       (psVar8);
    (*pEVar9->_vptr_ExtensionGenerator[4])(pEVar9,local_18);
  }
  for (local_54 = 0; iVar5 = local_54, iVar4 = FileDescriptor::message_type_count(this->file_),
      iVar5 < iVar4; local_54 = local_54 + 1) {
    psVar10 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
              ::operator[](&this->message_generators_,(long)local_54);
    pMVar11 = internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>::operator->
                        (psVar10);
    (*pMVar11->_vptr_MessageGenerator[6])(pMVar11,local_18);
  }
  io::Printer::Outdent(local_18);
  io::Printer::Print(local_18,"}\n");
  pFVar1 = this->file_;
  pCVar12 = internal::scoped_ptr<google::protobuf::compiler::java::Context>::operator->
                      (&this->context_);
  bVar3 = Context::EnforceLite(pCVar12);
  bVar3 = HasDescriptorMethods(pFVar1,bVar3);
  if (bVar3) {
    io::Printer::Print(local_18,
                       "\npublic static void registerAllExtensions(\n    com.google.protobuf.ExtensionRegistry registry) {\n  registerAllExtensions(\n      (com.google.protobuf.ExtensionRegistryLite) registry);\n}\n"
                      );
  }
  bVar3 = MultipleJavaFiles(this->file_,(bool)(this->immutable_api_ & 1));
  if (!bVar3) {
    for (local_58 = 0; iVar5 = local_58, iVar4 = FileDescriptor::enum_type_count(this->file_),
        iVar5 < iVar4; local_58 = local_58 + 1) {
      pFVar1 = this->file_;
      pCVar12 = internal::scoped_ptr<google::protobuf::compiler::java::Context>::operator->
                          (&this->context_);
      bVar3 = Context::EnforceLite(pCVar12);
      bVar3 = HasDescriptorMethods(pFVar1,bVar3);
      if (bVar3) {
        pEVar13 = FileDescriptor::enum_type(this->file_,local_58);
        bVar3 = this->immutable_api_;
        pCVar12 = internal::scoped_ptr<google::protobuf::compiler::java::Context>::get
                            (&this->context_);
        EnumGenerator::EnumGenerator(&local_a8,pEVar13,(bool)(bVar3 & 1),pCVar12);
        EnumGenerator::Generate(&local_a8,local_18);
        EnumGenerator::~EnumGenerator(&local_a8);
      }
      else {
        pEVar13 = FileDescriptor::enum_type(this->file_,local_58);
        bVar3 = this->immutable_api_;
        pCVar12 = internal::scoped_ptr<google::protobuf::compiler::java::Context>::get
                            (&this->context_);
        EnumLiteGenerator::EnumLiteGenerator
                  ((EnumLiteGenerator *)&i_4,pEVar13,(bool)(bVar3 & 1),pCVar12);
        EnumLiteGenerator::Generate((EnumLiteGenerator *)&i_4,local_18);
        EnumLiteGenerator::~EnumLiteGenerator((EnumLiteGenerator *)&i_4);
      }
    }
    for (generator.ptr_._4_4_ = 0; iVar5 = generator.ptr_._4_4_,
        iVar4 = FileDescriptor::message_type_count(this->file_), iVar5 < iVar4;
        generator.ptr_._4_4_ = generator.ptr_._4_4_ + 1) {
      psVar10 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
                ::operator[](&this->message_generators_,(long)generator.ptr_._4_4_);
      pMVar11 = internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>::operator->
                          (psVar10);
      (*pMVar11->_vptr_MessageGenerator[5])(pMVar11,local_18);
      psVar10 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
                ::operator[](&this->message_generators_,(long)generator.ptr_._4_4_);
      pMVar11 = internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>::operator->
                          (psVar10);
      (*pMVar11->_vptr_MessageGenerator[4])(pMVar11,local_18);
    }
    pFVar1 = this->file_;
    pCVar12 = internal::scoped_ptr<google::protobuf::compiler::java::Context>::operator->
                        (&this->context_);
    bVar3 = Context::EnforceLite(pCVar12);
    bVar3 = HasGenericServices(pFVar1,bVar3);
    if (bVar3) {
      for (generator.ptr_._0_4_ = 0; iVar5 = (int)generator.ptr_,
          iVar4 = FileDescriptor::service_count(this->file_), iVar5 < iVar4;
          generator.ptr_._0_4_ = (int)generator.ptr_ + 1) {
        pGVar14 = internal::scoped_ptr<google::protobuf::compiler::java::GeneratorFactory>::
                  operator->(&this->generator_factory_);
        pSVar15 = FileDescriptor::service(this->file_,(int)generator.ptr_);
        iVar5 = (*pGVar14->_vptr_GeneratorFactory[4])(pGVar14,pSVar15);
        internal::scoped_ptr<google::protobuf::compiler::java::ServiceGenerator>::scoped_ptr
                  ((scoped_ptr<google::protobuf::compiler::java::ServiceGenerator> *)
                   &static_block_bytecode_estimate,(ServiceGenerator *)CONCAT44(extraout_var,iVar5))
        ;
        pSVar16 = internal::scoped_ptr<google::protobuf::compiler::java::ServiceGenerator>::
                  operator->((scoped_ptr<google::protobuf::compiler::java::ServiceGenerator> *)
                             &static_block_bytecode_estimate);
        (*pSVar16->_vptr_ServiceGenerator[2])(pSVar16,local_18);
        internal::scoped_ptr<google::protobuf::compiler::java::ServiceGenerator>::~scoped_ptr
                  ((scoped_ptr<google::protobuf::compiler::java::ServiceGenerator> *)
                   &static_block_bytecode_estimate);
      }
    }
  }
  for (i_6 = 0; iVar5 = i_6, iVar4 = FileDescriptor::extension_count(this->file_), iVar5 < iVar4;
      i_6 = i_6 + 1) {
    psVar8 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>_>
             ::operator[](&this->extension_generators_,(long)i_6);
    pEVar9 = internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>::operator->
                       (psVar8);
    (*pEVar9->_vptr_ExtensionGenerator[2])(pEVar9,local_18);
  }
  bytecode_estimate = 0;
  for (method_num = 0; iVar5 = method_num, iVar4 = FileDescriptor::message_type_count(this->file_),
      iVar5 < iVar4; method_num = method_num + 1) {
    psVar10 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
              ::operator[](&this->message_generators_,(long)method_num);
    pMVar11 = internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>::operator->
                        (psVar10);
    (*pMVar11->_vptr_MessageGenerator[2])(pMVar11,local_18,&bytecode_estimate);
  }
  io::Printer::Print(local_18,"\n");
  pFVar1 = this->file_;
  pCVar12 = internal::scoped_ptr<google::protobuf::compiler::java::Context>::operator->
                      (&this->context_);
  bVar3 = Context::EnforceLite(pCVar12);
  bVar3 = HasDescriptorMethods(pFVar1,bVar3);
  if (bVar3) {
    if ((this->immutable_api_ & 1U) == 0) {
      GenerateDescriptorInitializationCodeForMutable(this,local_18);
    }
    else {
      GenerateDescriptorInitializationCodeForImmutable(this,local_18);
    }
  }
  else {
    io::Printer::Print(local_18,"static {\n");
    io::Printer::Indent(local_18);
    i_7 = 0;
    local_11c = 0;
    for (local_120 = 0; iVar5 = FileDescriptor::message_type_count(this->file_), local_120 < iVar5;
        local_120 = local_120 + 1) {
      psVar10 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
                ::operator[](&this->message_generators_,(long)local_120);
      pMVar11 = internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>::operator->
                          (psVar10);
      iVar5 = (*pMVar11->_vptr_MessageGenerator[3])(pMVar11,local_18);
      i_7 = iVar5 + i_7;
      anon_unknown_0::MaybeRestartJavaMethod
                (local_18,&i_7,&local_11c,"_clinit_autosplit_$method_num$();\n",
                 "private static void _clinit_autosplit_$method_num$() {\n");
    }
    io::Printer::Outdent(local_18);
    io::Printer::Print(local_18,"}\n");
  }
  io::Printer::Print(local_18,"\n// @@protoc_insertion_point(outer_class_scope)\n");
  io::Printer::Outdent(local_18);
  io::Printer::Print(local_18,"}\n");
  return;
}

Assistant:

void FileGenerator::Generate(io::Printer* printer) {
  // We don't import anything because we refer to all classes by their
  // fully-qualified names in the generated source.
  printer->Print(
    "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
    "// source: $filename$\n"
    "\n",
    "filename", file_->name());
  if (!java_package_.empty()) {
    printer->Print(
      "package $package$;\n"
      "\n",
      "package", java_package_);
  }
  PrintGeneratedAnnotation(
      printer, '$', options_.annotate_code ? classname_ + ".java.pb.meta" : "");
  printer->Print(
      "public final class $classname$ {\n"
      "  private $ctor$() {}\n",
      "classname", classname_, "ctor", classname_);
  printer->Annotate("classname", file_->name());
  printer->Indent();

  // -----------------------------------------------------------------

  printer->Print(
    "public static void registerAllExtensions(\n"
    "    com.google.protobuf.ExtensionRegistryLite registry) {\n");

  printer->Indent();

  for (int i = 0; i < file_->extension_count(); i++) {
    extension_generators_[i]->GenerateRegistrationCode(printer);
  }

  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateExtensionRegistrationCode(printer);
  }

  printer->Outdent();
  printer->Print(
    "}\n");
  if (HasDescriptorMethods(file_, context_->EnforceLite())) {
    // Overload registerAllExtensions for the non-lite usage to
    // redundantly maintain the original signature (this is
    // redundant because ExtensionRegistryLite now invokes
    // ExtensionRegistry in the non-lite usage). Intent is
    // to remove this in the future.
    printer->Print(
      "\n"
      "public static void registerAllExtensions(\n"
      "    com.google.protobuf.ExtensionRegistry registry) {\n"
      "  registerAllExtensions(\n"
      "      (com.google.protobuf.ExtensionRegistryLite) registry);\n"
      "}\n");
  }

  // -----------------------------------------------------------------

  if (!MultipleJavaFiles(file_, immutable_api_)) {
    for (int i = 0; i < file_->enum_type_count(); i++) {
      if (HasDescriptorMethods(file_, context_->EnforceLite())) {
        EnumGenerator(file_->enum_type(i), immutable_api_, context_.get())
            .Generate(printer);
      } else {
        EnumLiteGenerator(file_->enum_type(i), immutable_api_, context_.get())
            .Generate(printer);
      }
    }
    for (int i = 0; i < file_->message_type_count(); i++) {
      message_generators_[i]->GenerateInterface(printer);
      message_generators_[i]->Generate(printer);
    }
    if (HasGenericServices(file_, context_->EnforceLite())) {
      for (int i = 0; i < file_->service_count(); i++) {
        google::protobuf::scoped_ptr<ServiceGenerator> generator(
            generator_factory_->NewServiceGenerator(file_->service(i)));
        generator->Generate(printer);
      }
    }
  }

  // Extensions must be generated in the outer class since they are values,
  // not classes.
  for (int i = 0; i < file_->extension_count(); i++) {
    extension_generators_[i]->Generate(printer);
  }

  // Static variables. We'd like them to be final if possible, but due to
  // the JVM's 64k size limit on static blocks, we have to initialize some
  // of them in methods; thus they cannot be final.
  int static_block_bytecode_estimate = 0;
  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateStaticVariables(
        printer, &static_block_bytecode_estimate);
  }

  printer->Print("\n");

  if (HasDescriptorMethods(file_, context_->EnforceLite())) {
    if (immutable_api_) {
      GenerateDescriptorInitializationCodeForImmutable(printer);
    } else {
      GenerateDescriptorInitializationCodeForMutable(printer);
    }
  } else {
    printer->Print(
      "static {\n");
    printer->Indent();
    int bytecode_estimate = 0;
    int method_num = 0;

    for (int i = 0; i < file_->message_type_count(); i++) {
      bytecode_estimate += message_generators_[i]->GenerateStaticVariableInitializers(printer);
      MaybeRestartJavaMethod(
        printer,
        &bytecode_estimate, &method_num,
        "_clinit_autosplit_$method_num$();\n",
        "private static void _clinit_autosplit_$method_num$() {\n");
    }

    printer->Outdent();
    printer->Print(
      "}\n");
  }

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(outer_class_scope)\n");

  printer->Outdent();
  printer->Print("}\n");
}